

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::InsertNoImplicitCallUses(GlobOpt *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int index;
  undefined4 *puVar4;
  Instr *this_00;
  PragmaInstr *this_01;
  Type *ppOVar5;
  Opnd *pOVar6;
  Instr *noImplicitCallUses;
  int i;
  Instr *insertBeforeInstr;
  int n;
  Instr *instr_local;
  GlobOpt *this_local;
  
  if (this->noImplicitCallUsesToInsert == (OpndList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3536,"(noImplicitCallUsesToInsert)","noImplicitCallUsesToInsert");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  iVar3 = JsUtil::ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>::Count
                    (&this->noImplicitCallUsesToInsert->
                      super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>);
  if (iVar3 != 0) {
    this_00 = IR::Instr::GetInsertBeforeByteCodeUsesInstr(instr);
    noImplicitCallUses._4_4_ = 0;
    while (noImplicitCallUses._4_4_ < iVar3) {
      this_01 = IR::PragmaInstr::New(NoImplicitCallUses,0,instr->m_func);
      ppOVar5 = JsUtil::
                List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->noImplicitCallUsesToInsert,noImplicitCallUses._4_4_);
      IR::Instr::SetSrc1(&this_01->super_Instr,*ppOVar5);
      pOVar6 = IR::Instr::GetSrc1(&this_01->super_Instr);
      IR::Opnd::SetIsJITOptimizedReg(pOVar6,true);
      index = noImplicitCallUses._4_4_ + 1;
      if (index < iVar3) {
        ppOVar5 = JsUtil::
                  List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this->noImplicitCallUsesToInsert,index);
        IR::Instr::SetSrc2(&this_01->super_Instr,*ppOVar5);
        pOVar6 = IR::Instr::GetSrc2(&this_01->super_Instr);
        IR::Opnd::SetIsJITOptimizedReg(pOVar6,true);
        index = noImplicitCallUses._4_4_ + 2;
      }
      noImplicitCallUses._4_4_ = index;
      IR::Instr::SetByteCodeOffset(&this_01->super_Instr,instr);
      IR::Instr::InsertBefore(this_00,&this_01->super_Instr);
    }
    JsUtil::
    List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Clear
              (this->noImplicitCallUsesToInsert);
  }
  return;
}

Assistant:

void
GlobOpt::InsertNoImplicitCallUses(IR::Instr *const instr)
{
    Assert(noImplicitCallUsesToInsert);

    const int n = noImplicitCallUsesToInsert->Count();
    if(n == 0)
    {
        return;
    }

    IR::Instr *const insertBeforeInstr = instr->GetInsertBeforeByteCodeUsesInstr();
    for(int i = 0; i < n;)
    {
        IR::Instr *const noImplicitCallUses = IR::PragmaInstr::New(Js::OpCode::NoImplicitCallUses, 0, instr->m_func);
        noImplicitCallUses->SetSrc1(noImplicitCallUsesToInsert->Item(i));
        noImplicitCallUses->GetSrc1()->SetIsJITOptimizedReg(true);
        ++i;
        if(i < n)
        {
            noImplicitCallUses->SetSrc2(noImplicitCallUsesToInsert->Item(i));
            noImplicitCallUses->GetSrc2()->SetIsJITOptimizedReg(true);
            ++i;
        }
        noImplicitCallUses->SetByteCodeOffset(instr);
        insertBeforeInstr->InsertBefore(noImplicitCallUses);
    }
    noImplicitCallUsesToInsert->Clear();
}